

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.cc
# Opt level: O1

bool absl::lts_20250127::str_format_internal::ConvertIntArg<signed_char>
               (char v,FormatConversionSpecImpl conv,FormatSinkImpl *sink)

{
  bool bVar1;
  Nonnull<char_*> pcVar2;
  uint i;
  FormatSinkImpl *in_R8;
  char *buffer;
  FormatConversionSpecImpl conv_00;
  FormatConversionSpecImpl conv_01;
  FormatConversionSpecImpl conv_02;
  string_view v_00;
  undefined8 local_60;
  uint local_58;
  char *local_50;
  size_t local_48;
  char local_40 [42];
  undefined2 local_16;
  char local_14 [4];
  
  conv_01.width_ = (undefined4)((ulong)register0x00000010 >> 0x20);
  conv_01._0_4_ = conv.precision_;
  conv_00._0_8_ = conv._0_8_;
  conv_01.precision_ = (int)sink;
  local_60 = conv_00._0_8_;
  local_58 = conv_01._0_4_;
  switch((ulong)conv_00._0_8_ & 0xff) {
  case 0:
    local_60._2_1_ = conv.length_mod_;
    if (local_60._2_1_ != l) {
      conv_00.precision_ = conv_01.precision_;
      anon_unknown_53::ConvertCharImpl
                (v,conv_00,(FormatSinkImpl *)&switchD_00258769::switchdataD_002dc67c);
      return true;
    }
    bVar1 = anon_unknown_53::ConvertWCharTImpl
                      ((anon_unknown_53 *)(ulong)(uint)(int)v,conv._0_4_,conv_01,in_R8);
    return bVar1;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/str_format/arg.cc"
                  ,0x1c2,
                  "bool absl::str_format_internal::ConvertIntArg(T, FormatConversionSpecImpl, FormatSinkImpl *) [T = signed char]"
                 );
  case 2:
  case 3:
  case 0x12:
    i = (uint)v;
    break;
  case 4:
    buffer = local_14;
    do {
      buffer[-1] = v & 7U | 0x30;
      buffer = buffer + -1;
      bVar1 = 7 < (byte)v;
      v = (byte)v >> 3;
    } while (bVar1);
    goto LAB_00258802;
  case 5:
    i = (uint)(byte)v;
    break;
  case 6:
    local_16 = *(undefined2 *)(numbers_internal::kHexTable + (ulong)(byte)v * 2);
    buffer = (char *)((long)&local_16 + 1);
    if ((char)local_16 != '0') {
      buffer = (char *)&local_16;
    }
    pcVar2 = local_14;
    local_50 = buffer;
    goto LAB_00258858;
  case 7:
    buffer = local_14;
    do {
      buffer[-1] = "0123456789ABCDEF"[(byte)v & 0xf];
      buffer = buffer + -1;
      bVar1 = 0xf < (byte)v;
      v = (byte)v >> 4;
    } while (bVar1);
LAB_00258802:
    pcVar2 = local_14;
    local_50 = buffer;
    goto LAB_00258858;
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
    bVar1 = ConvertFloatImpl((double)(int)v,(FormatConversionSpecImpl *)&local_60,sink);
    return bVar1;
  }
  buffer = local_40;
  local_50 = buffer;
  pcVar2 = numbers_internal::FastIntToBuffer(i,buffer);
LAB_00258858:
  local_48 = (long)pcVar2 - (long)buffer;
  if (local_60._1_1_ == kBasic) {
    v_00._M_str = local_50;
    v_00._M_len = local_48;
    FormatSinkImpl::Append(sink,v_00);
  }
  else {
    conv_02.width_ = 0;
    conv_02.conv_ = (undefined1)local_58;
    conv_02.flags_ = local_58._1_1_;
    conv_02.length_mod_ = local_58._2_1_;
    conv_02._3_1_ = local_58._3_1_;
    conv_02.precision_ = conv_01.precision_;
    anon_unknown_53::ConvertIntImplInnerSlow((anon_unknown_53 *)&local_50,local_60,conv_02,in_R8);
  }
  return true;
}

Assistant:

bool ConvertIntArg(T v, FormatConversionSpecImpl conv, FormatSinkImpl *sink) {
  using U = typename MakeUnsigned<T>::type;
  IntDigits as_digits;

  // This odd casting is due to a bug in -Wswitch behavior in gcc49 which causes
  // it to complain about a switch/case type mismatch, even though both are
  // FormatConversionChar.  Likely this is because at this point
  // FormatConversionChar is declared, but not defined.
  switch (static_cast<uint8_t>(conv.conversion_char())) {
    case static_cast<uint8_t>(FormatConversionCharInternal::c):
      return (std::is_same<T, wchar_t>::value ||
              (conv.length_mod() == LengthMod::l))
                 ? ConvertWCharTImpl(static_cast<wchar_t>(v), conv, sink)
                 : ConvertCharImpl(static_cast<char>(v), conv, sink);

    case static_cast<uint8_t>(FormatConversionCharInternal::o):
      as_digits.PrintAsOct(static_cast<U>(v));
      break;

    case static_cast<uint8_t>(FormatConversionCharInternal::x):
      as_digits.PrintAsHexLower(static_cast<U>(v));
      break;
    case static_cast<uint8_t>(FormatConversionCharInternal::X):
      as_digits.PrintAsHexUpper(static_cast<U>(v));
      break;

    case static_cast<uint8_t>(FormatConversionCharInternal::u):
      as_digits.PrintAsDec(static_cast<U>(v));
      break;

    case static_cast<uint8_t>(FormatConversionCharInternal::d):
    case static_cast<uint8_t>(FormatConversionCharInternal::i):
    case static_cast<uint8_t>(FormatConversionCharInternal::v):
      as_digits.PrintAsDec(v);
      break;

    case static_cast<uint8_t>(FormatConversionCharInternal::a):
    case static_cast<uint8_t>(FormatConversionCharInternal::e):
    case static_cast<uint8_t>(FormatConversionCharInternal::f):
    case static_cast<uint8_t>(FormatConversionCharInternal::g):
    case static_cast<uint8_t>(FormatConversionCharInternal::A):
    case static_cast<uint8_t>(FormatConversionCharInternal::E):
    case static_cast<uint8_t>(FormatConversionCharInternal::F):
    case static_cast<uint8_t>(FormatConversionCharInternal::G):
      return ConvertFloatImpl(static_cast<double>(v), conv, sink);

    default:
      ABSL_ASSUME(false);
  }

  if (conv.is_basic()) {
    sink->Append(as_digits.with_neg_and_zero());
    return true;
  }
  return ConvertIntImplInnerSlow(as_digits, conv, sink);
}